

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O1

void __thiscall
Disa::Vector_Dense<double,_0UL>::Vector_Dense
          (Vector_Dense<double,_0UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  pointer pdVar1;
  undefined8 uVar2;
  ulong uVar3;
  double dVar4;
  allocator_type local_29;
  ulong local_28;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&this->super_vector<double,_std::allocator<double>_>,size,&local_29);
  if ((this->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != (this->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar3 = 0;
    do {
      local_28 = uVar3;
      if ((lambda->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (pdVar1 != (pointer)0x0) {
          operator_delete(pdVar1,(long)(this->super_vector<double,_std::allocator<double>_>).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
        }
        _Unwind_Resume(uVar2);
      }
      dVar4 = (*lambda->_M_invoker)((_Any_data *)lambda,&local_28);
      pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar1[uVar3] = dVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->super_vector<double,_std::allocator<double>_>).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  return;
}

Assistant:

explicit Vector_Dense(const std::function<_type(std::size_t)>& lambda, std::size_t size) : std::vector<_type>(size) {
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }